

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O2

uint32 * rw::ps2::instanceRGBA(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  RGBA *pRVar1;
  ulong uVar2;
  RGBA *pRVar3;
  uint uVar4;
  
  uVar4 = n + idx;
  if ((g->flags & 8) == 0) {
    for (; pRVar3 = (RGBA *)p, idx < uVar4; idx = idx + 1) {
      ((RGBA *)p)->red = '\0';
      ((RGBA *)p)->green = '\0';
      ((RGBA *)p)->blue = '\0';
      ((RGBA *)p)->alpha = 0xff;
      p = (uint32 *)((RGBA *)p + 1);
    }
  }
  else {
    pRVar1 = g->colors;
    for (uVar2 = (ulong)idx; pRVar3 = (RGBA *)p, uVar2 < uVar4; uVar2 = uVar2 + 1) {
      *p = (uint32)pRVar1[m->indices[uVar2]];
      p = (uint32 *)((RGBA *)p + 1);
    }
  }
  for (; ((ulong)pRVar3 & 0xf) != 0; pRVar3 = pRVar3 + 1) {
    ((RGBA *)p)->red = '\0';
    ((RGBA *)p)->green = '\0';
    ((RGBA *)p)->blue = '\0';
    ((RGBA *)p)->alpha = '\0';
    p = (uint32 *)((RGBA *)p + 1);
  }
  return p;
}

Assistant:

uint32*
instanceRGBA(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d = (uint32*)g->colors;
	if((g->flags & Geometry::PRELIT))
		for(uint32 i = idx; i < idx+n; i++){
			j = m->indices[i];
			*p++ = d[j];
		}
	else
		for(uint32 i = idx; i < idx+n; i++)
			*p++ = 0xFF000000;
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}